

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

deUint32 glu::getGLFilterMode(FilterMode filterMode)

{
  InternalError *this;
  allocator<char> local_31;
  string local_30;
  FilterMode local_10;
  deUint32 local_c;
  FilterMode filterMode_local;
  
  switch(filterMode) {
  case NEAREST:
    local_c = 0x2600;
    break;
  case LINEAR:
    local_c = 0x2601;
    break;
  case NEAREST_MIPMAP_NEAREST:
    local_c = 0x2700;
    break;
  case NEAREST_MIPMAP_LINEAR:
    local_c = 0x2702;
    break;
  case LINEAR_MIPMAP_NEAREST:
    local_c = 0x2701;
    break;
  case LINEAR_MIPMAP_LINEAR:
    local_c = 0x2703;
    break;
  default:
    local_10 = filterMode;
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Can\'t map filter mode",&local_31);
    tcu::InternalError::InternalError(this,&local_30);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return local_c;
}

Assistant:

deUint32 getGLFilterMode (tcu::Sampler::FilterMode filterMode)
{
	DE_ASSERT(filterMode != tcu::Sampler::FILTERMODE_LAST);
	switch (filterMode)
	{
		case tcu::Sampler::NEAREST:					return GL_NEAREST;
		case tcu::Sampler::LINEAR:					return GL_LINEAR;
		case tcu::Sampler::NEAREST_MIPMAP_NEAREST:	return GL_NEAREST_MIPMAP_NEAREST;
		case tcu::Sampler::NEAREST_MIPMAP_LINEAR:	return GL_NEAREST_MIPMAP_LINEAR;
		case tcu::Sampler::LINEAR_MIPMAP_NEAREST:	return GL_LINEAR_MIPMAP_NEAREST;
		case tcu::Sampler::LINEAR_MIPMAP_LINEAR:	return GL_LINEAR_MIPMAP_LINEAR;
		default:
			throw tcu::InternalError("Can't map filter mode");
	}
}